

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regenc.c
# Opt level: O0

int onig_codes_byte_at(OnigCodePoint *codes,int at)

{
  OnigCodePoint code;
  int b;
  int index;
  int at_local;
  OnigCodePoint *codes_local;
  
  return codes[at / 3] >> (('\x02' - (char)(at % 3)) * '\b' & 0x1fU) & 0xff;
}

Assistant:

extern int
onig_codes_byte_at(OnigCodePoint codes[], int at)
{
  int index;
  int b;
  OnigCodePoint code;

  index = at / 3;
  b     = at % 3;
  code = codes[index];

  return ((code >> ((2 - b) * 8)) & 0xff);
}